

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimension2d.h
# Opt level: O2

dimension2d<unsigned_int> __thiscall
irr::core::dimension2d<unsigned_int>::getOptimalSize
          (dimension2d<unsigned_int> *this,bool requirePowerOfTwo,bool requireSquare,bool larger,
          u32 maxValue)

{
  uint uVar1;
  dimension2d<unsigned_int> dVar2;
  uint uVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  uint uVar5;
  
  uVar5 = this->Width;
  if ((int)CONCAT71(in_register_00000031,requirePowerOfTwo) == 0) {
    uVar3 = this->Height;
  }
  else {
    uVar3 = 1;
    do {
      uVar4 = uVar3;
      uVar3 = uVar4 * 2;
    } while (uVar4 < uVar5);
    uVar1 = 1;
    do {
      uVar3 = uVar1;
      uVar1 = uVar3 * 2;
    } while (uVar3 < this->Height);
    uVar5 = uVar4 >> ((uVar4 != uVar5 && uVar4 != 1) && !larger);
    uVar3 = uVar3 >> ((uVar3 != this->Height && uVar3 != 1) && !larger);
  }
  uVar4 = uVar3;
  if ((requireSquare) && ((!larger || (uVar4 = uVar5, uVar5 <= uVar3)))) {
    if (uVar3 <= uVar5) {
      uVar5 = uVar3;
    }
    uVar4 = uVar5;
    if (larger) {
      uVar5 = uVar3;
      uVar4 = uVar3;
    }
  }
  uVar3 = maxValue;
  if (uVar5 < maxValue) {
    uVar3 = uVar5;
  }
  uVar1 = maxValue;
  if (uVar4 < maxValue) {
    uVar1 = uVar4;
  }
  if (maxValue == 0) {
    uVar1 = uVar4;
    uVar3 = uVar5;
  }
  dVar2.Height = uVar1;
  dVar2.Width = uVar3;
  return dVar2;
}

Assistant:

dimension2d<T> getOptimalSize(
			bool requirePowerOfTwo = true,
			bool requireSquare = false,
			bool larger = true,
			u32 maxValue = 0) const
	{
		u32 i = 1;
		u32 j = 1;
		if (requirePowerOfTwo) {
			while (i < (u32)Width)
				i <<= 1;
			if (!larger && i != 1 && i != (u32)Width)
				i >>= 1;
			while (j < (u32)Height)
				j <<= 1;
			if (!larger && j != 1 && j != (u32)Height)
				j >>= 1;
		} else {
			i = (u32)Width;
			j = (u32)Height;
		}

		if (requireSquare) {
			if ((larger && (i > j)) || (!larger && (i < j)))
				j = i;
			else
				i = j;
		}

		if (maxValue > 0 && i > maxValue)
			i = maxValue;

		if (maxValue > 0 && j > maxValue)
			j = maxValue;

		return dimension2d<T>((T)i, (T)j);
	}